

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O3

void glist_redrawall(_glist *gl,int action)

{
  _glist *in_RAX;
  _glist *p_Var1;
  _glist *p_Var2;
  int flag;
  byte bVar3;
  
  if ((gl->field_0xe8 & 8) == 0) {
    p_Var1 = glist_getcanvas(in_RAX);
    bVar3 = (p_Var1->field_0xe8 & 2) >> 1;
  }
  else {
    bVar3 = 0;
  }
  p_Var1 = (_glist *)gl->gl_list;
  do {
    if (p_Var1 == (_glist *)0x0) {
      return;
    }
    p_Var2 = (_glist *)(p_Var1->gl_obj).te_g.g_pd;
    if ((p_Var2 == (_glist *)scalar_class & bVar3) == 1) {
      if (action == 2) {
        if (((gl->field_0xe8 & 8) == 0) &&
           (p_Var2 = glist_getcanvas(p_Var2), (p_Var2->field_0xe8 & 2) != 0)) {
          flag = 0;
LAB_00138ac9:
          gobj_vis((t_gobj *)p_Var1,gl,flag);
        }
      }
      else if (action == 1) {
        if (((gl->field_0xe8 & 8) == 0) &&
           (p_Var2 = glist_getcanvas(p_Var2), (p_Var2->field_0xe8 & 2) != 0)) {
          flag = 1;
          goto LAB_00138ac9;
        }
      }
      else {
        scalar_redraw((t_scalar *)p_Var1,gl);
      }
    }
    else if (p_Var2 == (_glist *)canvas_class) {
      glist_redrawall(p_Var1,action);
    }
    p_Var1 = (_glist *)(p_Var1->gl_obj).te_g.g_next;
  } while( true );
}

Assistant:

static void glist_redrawall(t_glist *gl, int action)
{
    t_gobj *g;
    int vis = glist_isvisible(gl);
    for (g = gl->gl_list; g; g = g->g_next)
    {
        if (vis && g->g_pd == scalar_class)
        {
            if (action == 1)
            {
                if (glist_isvisible(gl))
                    gobj_vis(g, gl, 1);
            }
            else if (action == 2)
            {
                if (glist_isvisible(gl))
                    gobj_vis(g, gl, 0);
            }
            else scalar_redraw((t_scalar *)g, gl);
        }
        else if (g->g_pd == canvas_class)
            glist_redrawall((t_glist *)g, action);
    }
}